

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  _Rb_tree_node_base *p_Var1;
  pointer pVVar2;
  pointer pVVar3;
  Variable<tcu::Vector<float,_3>_> *pVVar4;
  pointer pcVar5;
  PrecisionCase *pPVar6;
  undefined8 uVar7;
  bool bVar8;
  ContextType type;
  int iVar9;
  uint uVar10;
  _Rb_tree_node_base *p_Var11;
  char *__s;
  size_t sVar12;
  long *plVar13;
  ShaderExecutor *pSVar14;
  long lVar15;
  IVal *pIVar16;
  TestError *this_00;
  TestLog *pTVar17;
  Vector<float,_3> *pVVar18;
  size_t sVar19;
  FloatFormat *fmt;
  MessageBuilder *pMVar20;
  ulong uVar21;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar22;
  byte bVar23;
  IVal reference1;
  FuncSet funcs;
  IVal reference0;
  IVal in3;
  ostringstream os;
  Environment env;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_528 [8];
  PrecisionCase *local_520;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_518;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_510;
  undefined1 auStack_508 [7];
  IVal local_501;
  undefined1 local_500 [16];
  undefined1 local_4f0 [24];
  double local_4d8;
  undefined1 auStack_4c0 [8];
  undefined1 local_4b8 [8];
  undefined8 local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8 [3];
  Statement *local_470;
  size_t local_468;
  ulong local_460;
  string local_458;
  undefined1 local_438 [8];
  undefined1 auStack_430 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  double local_418;
  Data local_410;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2b8;
  ulong local_288;
  ResultCollector *local_280;
  FloatFormat local_278;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar23 = 0;
  pVVar2 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar19 = ((long)pVVar3 - (long)pVVar2 >> 2) * -0x5555555555555555;
  local_518 = variables;
  local_510 = inputs;
  local_470 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_250,sVar19);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_278.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_278.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_278.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_278.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_278.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_278.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_278.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_278.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_278._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b8._M_impl.super__Rb_tree_header._M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_520 = this;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"Statement: ",0xb);
  (*local_470->_vptr_Statement[2])(local_470,(ostringstream *)auStack_430);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_468 = sVar19;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = (_Rb_tree_node_base *)(local_500 + 8);
  local_500._8_4_ = _S_red;
  local_4f0._0_8_ = (_Base_ptr)0x0;
  local_4d8 = 0.0;
  local_4f0._8_8_ = p_Var1;
  local_4f0._16_8_ = p_Var1;
  (*local_470->_vptr_Statement[4])(local_470,local_500);
  if ((_Rb_tree_node_base *)local_4f0._8_8_ != p_Var1) {
    p_Var11 = (_Rb_tree_node_base *)local_4f0._8_8_;
    do {
      (**(code **)(**(long **)(p_Var11 + 1) + 0x30))(*(long **)(p_Var11 + 1),local_1a8);
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != p_Var1);
  }
  if (local_4d8 != 0.0) {
    local_438 = (undefined1  [8])((local_520->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_430,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_430,(char *)local_4b8,CONCAT44(local_4b0._4_4_,(float)local_4b0));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_4b8 != (undefined1  [8])local_4a8) {
      operator_delete((void *)local_4b8,local_4a8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_500);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"precision ",10);
  __s = glu::getPrecisionName((local_520->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_528 + (long)((TestLog *)((long)local_438 + -0x18))->m_log) + 0xf0)
    ;
  }
  else {
    sVar12 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,__s,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar5 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_520->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar22 = local_518;
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_520->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_520->m_extension);
    plVar13 = (long *)std::__cxx11::string::append(local_1a8);
    pTVar17 = (TestLog *)(plVar13 + 2);
    if ((TestLog *)*plVar13 == pTVar17) {
      local_428._M_allocated_capacity = (size_type)pTVar17->m_log;
      local_428._8_8_ = plVar13[3];
      local_438 = (undefined1  [8])(auStack_430 + 8);
    }
    else {
      local_428._M_allocated_capacity = (size_type)pTVar17->m_log;
      local_438 = (undefined1  [8])*plVar13;
    }
    auStack_430 = (undefined1  [8])plVar13[1];
    *plVar13 = (long)pTVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_438);
    if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
      operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
    }
    pVVar22 = local_518;
    if ((pointer)local_1a8._0_8_ != pcVar5) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),3);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_438,local_520,
             (pVVar22->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar7 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x70),(string *)local_438);
  glu::VarType::operator=(&((pointer)(uVar7 + 0x70))->varType,(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  pVVar22 = local_518;
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_438,local_520,
             (pVVar22->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar7 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_438);
  glu::VarType::operator=(&((pointer)(uVar7 + 0x38))->varType,(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  pVVar22 = local_518;
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_438,local_520,
             (pVVar22->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar7 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar7 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),1);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_438,local_520,
             (local_518->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar7 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar7 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  (*local_470->_vptr_Statement[2])(local_470,local_438);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar6 = local_520;
  pSVar14 = ShaderExecUtil::createExecutor
                      ((local_520->m_ctx).renderContext,(local_520->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  sVar19 = local_468;
  local_438 = (undefined1  [8])
              (local_510->in0).
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  auStack_430 = (undefined1  [8])
                (local_510->in1).
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_428._M_allocated_capacity =
       (size_type)
       (local_510->in2).
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_428._8_8_ =
       (local_510->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar14->_vptr_ShaderExecutor[3])
            (pSVar14,((pPVar6->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar9 = (*pSVar14->_vptr_ShaderExecutor[2])(pSVar14);
  if ((char)iVar9 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar14->_vptr_ShaderExecutor[5])(pSVar14);
  (*pSVar14->_vptr_ShaderExecutor[6])(pSVar14,sVar19 & 0xffffffff,local_438,local_1a8);
  fmt = &(pPVar6->m_ctx).floatFormat;
  (*pSVar14->_vptr_ShaderExecutor[1])(pSVar14);
  pVVar22 = local_518;
  lVar15 = 8;
  do {
    local_438[lVar15 + -8] = 0;
    *(undefined8 *)(local_438 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)(auStack_430 + lVar15) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x50);
  lVar15 = 8;
  do {
    local_438[lVar15 + -8] = 0;
    *(undefined8 *)(local_438 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)(auStack_430 + lVar15) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x50);
  lVar15 = 8;
  do {
    local_1a8[lVar15 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar15 + 8) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x50);
  lVar15 = 8;
  do {
    local_1a8[lVar15 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar15 + 8) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x50);
  lVar15 = 8;
  do {
    auStack_508[lVar15] = 0;
    *(undefined8 *)(local_500 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)(local_500 + lVar15 + 8) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x50);
  lVar15 = 8;
  do {
    auStack_508[lVar15] = 0;
    *(undefined8 *)(local_500 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)(local_500 + lVar15 + 8) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x50);
  lVar15 = 8;
  do {
    auStack_4c0[lVar15] = 0;
    *(undefined8 *)(local_4b8 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_4b0 + lVar15) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x50);
  lVar15 = 8;
  do {
    auStack_4c0[lVar15] = 0;
    *(undefined8 *)(local_4b8 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_4b0 + lVar15) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x50);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2b8,
             (local_518->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_438);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2b8,
             (pVVar22->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2b8,
             (pVVar22->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_500);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b8,
             (pVVar22->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_458);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2b8,
             (pVVar22->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_4b8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b8,
             (pVVar22->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_501);
  if (pVVar3 == pVVar2) {
LAB_01706f07:
    local_438 = (undefined1  [8])((local_520->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_280 = &local_520->m_status;
    local_288 = sVar19 + (sVar19 == 0);
    uVar21 = 0;
    local_460 = 0;
    do {
      lVar15 = 8;
      do {
        local_1a8[lVar15 + -8] = 0;
        *(undefined8 *)(local_1a8 + lVar15) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar15 + 8) = 0xfff0000000000000;
        lVar15 = lVar15 + 0x18;
      } while (lVar15 != 0x50);
      lVar15 = 8;
      do {
        local_1a8[lVar15 + -8] = 0;
        *(undefined8 *)(local_1a8 + lVar15) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar15 + 8) = 0xfff0000000000000;
        lVar15 = lVar15 + 0x18;
      } while (lVar15 != 0x50);
      if ((uVar21 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_520->super_TestCase).super_TestNode.m_testCtx);
      }
      pVVar2 = (local_510->in0).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_4b0._0_4_ = pVVar2[uVar21].m_data[2];
      local_4b8 = *(undefined1 (*) [8])pVVar2[uVar21].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_500,fmt,(Vector<float,_3> *)local_4b8);
      pVVar22 = local_518;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_438,fmt,(IVal *)local_500);
      pIVar16 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2b8,
                           (pVVar22->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pMVar20 = (MessageBuilder *)local_438;
      for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
        *(TestLog **)pIVar16->m_data = pMVar20->m_log;
        pMVar20 = (MessageBuilder *)((long)pMVar20 + (ulong)bVar23 * -0x10 + 8);
        pIVar16 = (IVal *)((long)pIVar16 + ((ulong)bVar23 * -2 + 1) * 8);
      }
      pVVar2 = (local_510->in1).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_4b0._0_4_ = pVVar2[uVar21].m_data[2];
      local_4b8 = *(undefined1 (*) [8])pVVar2[uVar21].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_500,fmt,(Vector<float,_3> *)local_4b8);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_438,fmt,(IVal *)local_500);
      pIVar16 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2b8,
                           (pVVar22->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pMVar20 = (MessageBuilder *)local_438;
      for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
        *(TestLog **)pIVar16->m_data = pMVar20->m_log;
        pMVar20 = (MessageBuilder *)((long)pMVar20 + (ulong)bVar23 * -0x10 + 8);
        pIVar16 = (IVal *)((long)pIVar16 + ((ulong)bVar23 * -2 + 1) * 8);
      }
      pVVar2 = (local_510->in2).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_4b0._0_4_ = pVVar2[uVar21].m_data[2];
      local_4b8 = *(undefined1 (*) [8])pVVar2[uVar21].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_500,fmt,(Vector<float,_3> *)local_4b8);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_438,fmt,(IVal *)local_500);
      pIVar16 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2b8,
                           (pVVar22->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pMVar20 = (MessageBuilder *)local_438;
      for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
        *(TestLog **)pIVar16->m_data = pMVar20->m_log;
        pMVar20 = (MessageBuilder *)((long)pMVar20 + (ulong)bVar23 * -0x10 + 8);
        pIVar16 = (IVal *)((long)pIVar16 + ((ulong)bVar23 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2b8,
                 (pVVar22->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_410.basic.type = (local_520->m_ctx).precision;
      local_418 = (pPVar6->m_ctx).floatFormat.m_maxValue;
      local_438 = *(undefined1 (*) [8])fmt;
      auStack_430 = *(undefined1 (*) [8])&(pPVar6->m_ctx).floatFormat.m_fractionBits;
      local_428._M_allocated_capacity = *(undefined8 *)&(pPVar6->m_ctx).floatFormat.m_hasInf;
      local_428._8_8_ = *(undefined8 *)&(pPVar6->m_ctx).floatFormat.m_exactPrecision;
      local_400 = 0;
      local_410._8_8_ = &local_2b8;
      (*local_470->_vptr_Statement[3])(local_470,(MessageBuilder *)local_438);
      pIVar16 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2b8,
                           (pVVar22->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_438,&local_278,pIVar16);
      pMVar20 = (MessageBuilder *)local_438;
      pIVar16 = (IVal *)local_1a8;
      for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
        *(TestLog **)pIVar16->m_data = pMVar20->m_log;
        pMVar20 = (MessageBuilder *)((long)pMVar20 + (ulong)bVar23 * -0x10 + 8);
        pIVar16 = (IVal *)((long)pIVar16 + ((ulong)bVar23 * -2 + 1) * 8);
      }
      bVar8 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                        ((IVal *)local_1a8,
                         local_250.out0.
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar21);
      local_438 = (undefined1  [8])(auStack_430 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 0 is outside acceptable range","");
      bVar8 = tcu::ResultCollector::check(local_280,bVar8,(string *)local_438);
      if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
        operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
      }
      pVVar22 = local_518;
      if (!bVar8) {
        uVar10 = (int)local_460 + 1;
        local_460 = (ulong)uVar10;
        if ((int)uVar10 < 0x65) {
          local_438 = (undefined1  [8])((local_520->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
          pVVar4 = (pVVar22->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          pVVar18 = (Vector<float,_3> *)local_4f0;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_500._0_8_ = pVVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_500._0_8_,
                     CONCAT44(local_500._12_4_,local_500._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_4b8,(BuiltinPrecisionTests *)&local_278,
                     (FloatFormat *)
                     ((local_510->in0).
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar21),pVVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_4b8,
                     CONCAT44(local_4b0._4_4_,(float)local_4b0));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
          if (local_4b8 != (undefined1  [8])local_4a8) {
            operator_delete((void *)local_4b8,local_4a8[0]._M_allocated_capacity + 1);
          }
          if ((Vector<float,_3> *)local_500._0_8_ != (Vector<float,_3> *)local_4f0) {
            operator_delete((void *)local_500._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4f0._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
          pVVar4 = (pVVar22->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          pVVar18 = (Vector<float,_3> *)local_4f0;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_500._0_8_ = pVVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_500._0_8_,
                     CONCAT44(local_500._12_4_,local_500._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_4b8,(BuiltinPrecisionTests *)&local_278,
                     (FloatFormat *)
                     ((local_510->in1).
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar21),pVVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_4b8,
                     CONCAT44(local_4b0._4_4_,(float)local_4b0));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
          if (local_4b8 != (undefined1  [8])local_4a8) {
            operator_delete((void *)local_4b8,local_4a8[0]._M_allocated_capacity + 1);
          }
          if ((Vector<float,_3> *)local_500._0_8_ != (Vector<float,_3> *)local_4f0) {
            operator_delete((void *)local_500._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4f0._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
          pVVar4 = (pVVar22->in2).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          pVVar18 = (Vector<float,_3> *)local_4f0;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_500._0_8_ = pVVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_500._0_8_,
                     CONCAT44(local_500._12_4_,local_500._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_4b8,(BuiltinPrecisionTests *)&local_278,
                     (FloatFormat *)
                     ((local_510->in2).
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar21),pVVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_4b8,
                     CONCAT44(local_4b0._4_4_,(float)local_4b0));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
          if (local_4b8 != (undefined1  [8])local_4a8) {
            operator_delete((void *)local_4b8,local_4a8[0]._M_allocated_capacity + 1);
          }
          if ((Vector<float,_3> *)local_500._0_8_ != (Vector<float,_3> *)local_4f0) {
            operator_delete((void *)local_500._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4f0._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
          pVVar4 = (pVVar22->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          pIVar16 = (IVal *)local_4f0;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_500._0_8_ = pIVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_500._0_8_,
                     CONCAT44(local_500._12_4_,local_500._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_4b8,(BuiltinPrecisionTests *)&local_278,
                     (FloatFormat *)
                     (local_250.out0.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar21),
                     (Vector<float,_3> *)pIVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,(char *)local_4b8,
                     CONCAT44(local_4b0._4_4_,(float)local_4b0));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,3>>
                    (&local_458,(BuiltinPrecisionTests *)&local_278,(FloatFormat *)local_1a8,pIVar16
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_430,local_458._M_dataplus._M_p,local_458._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
          }
          if (local_4b8 != (undefined1  [8])local_4a8) {
            operator_delete((void *)local_4b8,local_4a8[0]._M_allocated_capacity + 1);
          }
          if ((IVal *)local_500._0_8_ != (IVal *)local_4f0) {
            operator_delete((void *)local_500._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4f0._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
          std::ios_base::~ios_base(local_3c0);
        }
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != local_288);
    iVar9 = (int)local_460;
    if (iVar9 < 0x65) {
      if (iVar9 == 0) goto LAB_01706f07;
    }
    else {
      local_438 = (undefined1  [8])((local_520->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)auStack_430,iVar9 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
      std::ios_base::~ios_base(local_3c0);
    }
    local_438 = (undefined1  [8])((local_520->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::ostream::operator<<((ostringstream *)auStack_430,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_250.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.out0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}